

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O1

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::operator*
          (Matrix<long_double> *this,Matrix<long_double> *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pvVar4;
  long lVar5;
  Matrix<long_double> *this_00;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  longdouble *plVar9;
  pointer pvVar10;
  long lVar11;
  longdouble lVar12;
  
  if (this->M == other->N) {
    this_00 = (Matrix<long_double> *)operator_new(0x30);
    Matrix(this_00,this->N,other->M);
    sVar1 = this->N;
    if (sVar1 != 0) {
      sVar2 = other->M;
      sVar3 = this->M;
      sVar7 = 0;
      do {
        if (sVar2 != 0) {
          pvVar4 = (this->matrix).
                   super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar8 = 0;
          do {
            if (sVar3 != 0) {
              plVar9 = pvVar4[sVar7].super__Vector_base<long_double,_std::allocator<long_double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pvVar10 = (other->matrix).
                        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar5 = *(long *)&(this_00->matrix).
                                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[sVar7].
                                super__Vector_base<long_double,_std::allocator<long_double>_>.
                                _M_impl.super__Vector_impl_data;
              lVar11 = sVar8 * 0x10;
              lVar12 = *(longdouble *)(lVar5 + lVar11);
              sVar6 = sVar3;
              do {
                lVar12 = *(longdouble *)
                          (*(long *)&(pvVar10->
                                     super__Vector_base<long_double,_std::allocator<long_double>_>).
                                     _M_impl.super__Vector_impl_data + lVar11) * *plVar9 + lVar12;
                *(longdouble *)(lVar5 + lVar11) = lVar12;
                plVar9 = plVar9 + 1;
                pvVar10 = pvVar10 + 1;
                sVar6 = sVar6 - 1;
              } while (sVar6 != 0);
            }
            sVar8 = sVar8 + 1;
          } while (sVar8 != sVar2);
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != sVar1);
    }
  }
  else {
    this_00 = (Matrix<long_double> *)0x0;
  }
  return this_00;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::operator*(
        const neural_networks::utilities::Matrix<T> *other) const {
    if(M == other -> N) {
        neural_networks::utilities::Matrix<T> *C  = new Matrix(N, other -> M);
        if(!C) {
            std::cerr << "Matrix Multiplication: Unable to allocate new matrix product\n";
            return nullptr;
        }
        size_t i, j;
        register size_t k;
        for(i = 0; i < N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                for(k = 0; k < M; ++k) {
                    C -> matrix[i][j] += matrix[i][k] * other -> matrix[k][j]; }
            }
        }
        return C;

    } else {
        return nullptr;
    }
}